

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O3

CURLSHcode curl_share_setopt(Curl_share *share,CURLSHoption option,...)

{
  byte bVar1;
  CURLSHcode CVar2;
  int iVar3;
  CookieInfo *pCVar4;
  va_list param;
  curl_lock_function local_b8;
  
  if (share == (Curl_share *)0x0) {
    return CURLSHE_INVALID;
  }
  if (share->magic != 0x7e117a1e) {
    return CURLSHE_INVALID;
  }
  if (share->dirty != 0) {
    return CURLSHE_IN_USE;
  }
  CVar2 = CURLSHE_BAD_OPTION;
  switch(option) {
  case CURLSHOPT_SHARE:
    switch(local_b8._0_4_) {
    case 2:
      if (share->cookies == (CookieInfo *)0x0) {
        pCVar4 = Curl_cookie_init((Curl_easy *)0x0,(char *)0x0,(CookieInfo *)0x0,true);
        share->cookies = pCVar4;
LAB_00152a12:
        if (pCVar4 == (CookieInfo *)0x0) {
          return CURLSHE_NOMEM;
        }
      }
      break;
    case 3:
    case 6:
      break;
    case 4:
      if (share->sslsession == (Curl_ssl_session *)0x0) {
        share->max_ssl_sessions = 8;
        pCVar4 = (CookieInfo *)(*Curl_ccalloc)(8,200);
        share->sslsession = (Curl_ssl_session *)pCVar4;
        share->sessionage = 0;
        goto LAB_00152a12;
      }
      break;
    case 5:
      if (((share->cpool).idata == (Curl_easy *)0x0) &&
         (iVar3 = Curl_cpool_init(&share->cpool,Curl_on_disconnect,(Curl_multi *)0x0,share,0x67),
         iVar3 != 0)) {
        return CURLSHE_NOMEM;
      }
      break;
    case 7:
      if (share->hsts == (hsts *)0x0) {
        pCVar4 = (CookieInfo *)Curl_hsts_init();
        share->hsts = (hsts *)pCVar4;
        goto LAB_00152a12;
      }
      break;
    default:
      goto switchD_001527f3_default;
    }
    share->specifier = share->specifier | 1 << ((byte)local_b8 & 0x1f);
    break;
  case CURLSHOPT_UNSHARE:
    bVar1 = (byte)local_b8 & 0x1f;
    share->specifier = share->specifier & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    switch(local_b8._0_4_) {
    case 2:
      if (share->cookies != (CookieInfo *)0x0) {
        Curl_cookie_cleanup(share->cookies);
        share->cookies = (CookieInfo *)0x0;
      }
      break;
    case 3:
    case 5:
      break;
    case 4:
      (*Curl_cfree)(share->sslsession);
      share->sslsession = (Curl_ssl_session *)0x0;
      break;
    default:
      goto switchD_001527f3_default;
    case 7:
      if (share->hsts != (hsts *)0x0) {
        Curl_hsts_cleanup(&share->hsts);
      }
    }
    break;
  case CURLSHOPT_LOCKFUNC:
    share->lockfunc = local_b8;
    break;
  case CURLSHOPT_UNLOCKFUNC:
    share->unlockfunc = (curl_unlock_function)local_b8;
    break;
  case CURLSHOPT_USERDATA:
    share->clientdata = local_b8;
    break;
  default:
    goto switchD_001527f3_default;
  }
  CVar2 = CURLSHE_OK;
switchD_001527f3_default:
  return CVar2;
}

Assistant:

CURLSHcode
curl_share_setopt(struct Curl_share *share, CURLSHoption option, ...)
{
  va_list param;
  int type;
  curl_lock_function lockfunc;
  curl_unlock_function unlockfunc;
  void *ptr;
  CURLSHcode res = CURLSHE_OK;

  if(!GOOD_SHARE_HANDLE(share))
    return CURLSHE_INVALID;

  if(share->dirty)
    /* do not allow setting options while one or more handles are already
       using this share */
    return CURLSHE_IN_USE;

  va_start(param, option);

  switch(option) {
  case CURLSHOPT_SHARE:
    /* this is a type this share will share */
    type = va_arg(param, int);

    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(!share->cookies) {
        share->cookies = Curl_cookie_init(NULL, NULL, NULL, TRUE);
        if(!share->cookies)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_HSTS:
#ifndef CURL_DISABLE_HSTS
      if(!share->hsts) {
        share->hsts = Curl_hsts_init();
        if(!share->hsts)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HSTS */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      if(!share->sslsession) {
        share->max_ssl_sessions = 8;
        share->sslsession = calloc(share->max_ssl_sessions,
                                   sizeof(struct Curl_ssl_session));
        share->sessionage = 0;
        if(!share->sslsession)
          res = CURLSHE_NOMEM;
      }
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      /* It is safe to set this option several times on a share. */
      if(!share->cpool.idata) {
        if(Curl_cpool_init(&share->cpool, Curl_on_disconnect,
                           NULL, share, 103))
          res = CURLSHE_NOMEM;
      }
      break;

    case CURL_LOCK_DATA_PSL:
#ifndef USE_LIBPSL
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    default:
      res = CURLSHE_BAD_OPTION;
    }
    if(!res)
      share->specifier |= (unsigned int)(1<<type);
    break;

  case CURLSHOPT_UNSHARE:
    /* this is a type this share will no longer share */
    type = va_arg(param, int);
    share->specifier &= ~(unsigned int)(1<<type);
    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(share->cookies) {
        Curl_cookie_cleanup(share->cookies);
        share->cookies = NULL;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_HSTS:
#ifndef CURL_DISABLE_HSTS
      if(share->hsts) {
        Curl_hsts_cleanup(&share->hsts);
      }
#else   /* CURL_DISABLE_HSTS */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      Curl_safefree(share->sslsession);
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      break;

    default:
      res = CURLSHE_BAD_OPTION;
      break;
    }
    break;

  case CURLSHOPT_LOCKFUNC:
    lockfunc = va_arg(param, curl_lock_function);
    share->lockfunc = lockfunc;
    break;

  case CURLSHOPT_UNLOCKFUNC:
    unlockfunc = va_arg(param, curl_unlock_function);
    share->unlockfunc = unlockfunc;
    break;

  case CURLSHOPT_USERDATA:
    ptr = va_arg(param, void *);
    share->clientdata = ptr;
    break;

  default:
    res = CURLSHE_BAD_OPTION;
    break;
  }

  va_end(param);

  return res;
}